

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset_container_unit.c
# Opt level: O0

void xor_test(void)

{
  bitset_container_t *pbVar1;
  bitset_container_t *pbVar2;
  bitset_container_t *bitset;
  bitset_container_t *result;
  size_t x_2;
  size_t x_1;
  size_t x;
  bitset_container_t *TMP;
  bitset_container_t *BI;
  bitset_container_t *B2;
  bitset_container_t *B1;
  undefined8 in_stack_ffffffffffffffc8;
  int iVar3;
  char *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  bitset_container_t *src_1;
  
  iVar3 = (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  pbVar1 = bitset_container_create();
  pbVar2 = bitset_container_create();
  bitset = bitset_container_create();
  result = bitset_container_create();
  _assert_true((unsigned_long)result,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,iVar3);
  _assert_true((unsigned_long)result,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,iVar3);
  _assert_true((unsigned_long)result,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,iVar3);
  _assert_true((unsigned_long)result,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,iVar3);
  for (src_1 = (bitset_container_t *)0x0; src_1 < (bitset_container_t *)0x10000;
      src_1 = (bitset_container_t *)((long)&src_1->cardinality + 3)) {
    bitset_container_set(pbVar1,(uint16_t)src_1);
    bitset_container_set(bitset,(uint16_t)src_1);
  }
  for (pbVar1 = (bitset_container_t *)0x0; pbVar1 < (bitset_container_t *)0x10000;
      pbVar1 = (bitset_container_t *)((long)&pbVar1[3].words + 6)) {
    bitset_container_set(pbVar2,(uint16_t)pbVar1);
    bitset_container_set(bitset,(uint16_t)pbVar1);
  }
  for (pbVar2 = (bitset_container_t *)0x0; pbVar2 < (bitset_container_t *)0x10000;
      pbVar2 = (bitset_container_t *)((long)&pbVar2[0xb].words + 2)) {
    bitset_container_remove(bitset,(uint16_t)pbVar2);
  }
  bitset_container_xor(src_1,pbVar1,pbVar2);
  iVar3 = (int)((ulong)pbVar2 >> 0x20);
  bitset_container_equals(src_1,pbVar1);
  _assert_true((unsigned_long)result,(char *)src_1,(char *)pbVar1,iVar3);
  bitset_container_free((bitset_container_t *)0x1035af);
  bitset_container_free((bitset_container_t *)0x1035b9);
  bitset_container_free((bitset_container_t *)0x1035c3);
  bitset_container_free((bitset_container_t *)0x1035cd);
  return;
}

Assistant:

DEFINE_TEST(xor_test) {
    bitset_container_t* B1 = bitset_container_create();
    bitset_container_t* B2 = bitset_container_create();
    bitset_container_t* BI = bitset_container_create();
    bitset_container_t* TMP = bitset_container_create();

    assert_non_null(B1);
    assert_non_null(B2);
    assert_non_null(BI);
    assert_non_null(TMP);

    for (size_t x = 0; x < (1 << 16); x += 3) {
        bitset_container_set(B1, x);
        bitset_container_set(BI, x);
    }

    // important: 62 is not divisible by 3
    for (size_t x = 0; x < (1 << 16); x += 62) {
        bitset_container_set(B2, x);
        bitset_container_set(BI, x);
    }

    for (size_t x = 0; x < (1 << 16); x += 62 * 3) {
        bitset_container_remove(BI, x);
    }

    bitset_container_xor(B1, B2, TMP);
    assert_true(bitset_container_equals(TMP, BI));

    bitset_container_free(B1);
    bitset_container_free(B2);
    bitset_container_free(BI);
    bitset_container_free(TMP);
}